

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_match_accel.cpp
# Opt level: O0

bool __thiscall
lzham::search_accelerator::add_bytes_begin(search_accelerator *this,uint num_bytes,uint8 *pBytes)

{
  bool bVar1;
  uint i;
  uchar *puVar2;
  uchar *__src;
  void *in_RDX;
  uint in_ESI;
  long in_RDI;
  uint max_possible_dict_size;
  uint dict_bytes_to_mirror;
  uint add_pos;
  undefined4 in_stack_00000038;
  uint local_44;
  uint local_34;
  
  i = *(uint *)(in_RDI + 0x24) & *(uint *)(in_RDI + 0x20);
  puVar2 = vector<unsigned_char>::operator[]((vector<unsigned_char> *)(in_RDI + 0x30),i);
  memcpy(puVar2,in_RDX,(ulong)in_ESI);
  if (*(uint *)(in_RDI + 0x1c) < 0x10001) {
    local_34 = *(uint *)(in_RDI + 0x1c);
  }
  else {
    local_34 = 0x10000;
  }
  if (i < local_34) {
    puVar2 = vector<unsigned_char>::operator[]
                       ((vector<unsigned_char> *)(in_RDI + 0x30),*(uint *)(in_RDI + 0x1c));
    __src = vector<unsigned_char>::operator[]((vector<unsigned_char> *)(in_RDI + 0x30),0);
    memcpy(puVar2,__src,(ulong)local_34);
  }
  *(uint *)(in_RDI + 0x28) = in_ESI;
  local_44 = *(int *)(in_RDI + 0x1c) - in_ESI;
  if (*(uint *)(in_RDI + 0x2c) < local_44) {
    local_44 = *(uint *)(in_RDI + 0x2c);
  }
  *(uint *)(in_RDI + 0x2c) = local_44;
  *(undefined8 *)(in_RDI + 0x3f0) = 0;
  bVar1 = find_all_matches((search_accelerator *)CONCAT44(num_bytes,in_stack_00000038),pBytes._4_4_)
  ;
  return bVar1;
}

Assistant:

bool search_accelerator::add_bytes_begin(uint num_bytes, const uint8* pBytes)
   {
      LZHAM_ASSERT(num_bytes <= m_max_dict_size);
      LZHAM_ASSERT(!m_lookahead_size);

      uint add_pos = m_lookahead_pos & m_max_dict_size_mask;
      LZHAM_ASSERT((add_pos + num_bytes) <= m_max_dict_size);

      memcpy(&m_dict[add_pos], pBytes, num_bytes);

      uint dict_bytes_to_mirror = LZHAM_MIN(static_cast<uint>(CLZBase::cMaxHugeMatchLen), m_max_dict_size);
      if (add_pos < dict_bytes_to_mirror)
         memcpy(&m_dict[m_max_dict_size], &m_dict[0], dict_bytes_to_mirror);

      m_lookahead_size = num_bytes;

      uint max_possible_dict_size = m_max_dict_size - num_bytes;
      m_cur_dict_size = LZHAM_MIN(m_cur_dict_size, max_possible_dict_size);

      m_next_match_ref = 0;

      return find_all_matches(num_bytes);
   }